

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_decimal.cpp
# Opt level: O2

bool __thiscall
icu_63::numparse::impl::DecimalMatcher::match
          (DecimalMatcher *this,StringSegment *segment,ParsedNumber *result,int8_t exponentSign,
          UErrorCode *param_4)

{
  short sVar1;
  UnicodeString *pUVar2;
  bool bVar3;
  UBool UVar4;
  bool bVar5;
  int32_t iVar6;
  int32_t iVar7;
  uint c;
  uint uVar8;
  int32_t iVar9;
  int iVar10;
  int64_t iVar11;
  undefined7 in_register_00000009;
  __off_t __length;
  undefined4 uVar12;
  char *__file;
  int sepType;
  long lVar13;
  int32_t i;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  int local_18c;
  int32_t local_188;
  int local_184;
  int32_t local_180;
  int32_t local_17c;
  int32_t local_178;
  int local_154;
  UnicodeString actualDecimalString;
  DecimalQuantity digitsConsumed;
  UnicodeString actualGroupingString;
  UnicodeString local_70;
  
  bVar3 = ParsedNumber::seenNumber(result);
  if (exponentSign == '\0' && bVar3) {
    return false;
  }
  iVar6 = StringSegment::getOffset(segment);
  icu_63::number::impl::DecimalQuantity::DecimalQuantity(&digitsConsumed);
  digitsConsumed.bogus = true;
  actualGroupingString.super_Replaceable.super_UObject._vptr_UObject =
       (UObject)&PTR__UnicodeString_003edbf0;
  actualGroupingString.fUnion.fStackFields.fLengthAndFlags = 2;
  actualDecimalString.super_Replaceable.super_UObject._vptr_UObject =
       (UObject)&PTR__UnicodeString_003edbf0;
  actualDecimalString.fUnion.fStackFields.fLengthAndFlags = 2;
  UnicodeString::setToBogus(&actualGroupingString);
  UnicodeString::setToBogus(&actualDecimalString);
  local_184 = 0;
  local_17c = -1;
  sepType = -1;
  local_180 = 0;
  local_154 = 0;
  bVar3 = false;
  local_178 = local_17c;
  do {
    local_18c = 0;
LAB_00282ce5:
    iVar7 = StringSegment::length(segment);
    if (iVar7 < 1) goto LAB_002831b1;
    c = StringSegment::getCodePoint(segment);
    UVar4 = u_isdigit_63(c);
    if (UVar4 == '\0') {
LAB_00282d45:
      if ((this->fLocalDigitStrings).super_LocalPointerBase<const_icu_63::UnicodeString>.ptr !=
          (UnicodeString *)0x0) {
        lVar13 = 0;
        uVar14 = 0;
        bVar3 = false;
        do {
          if (uVar14 == 10) goto LAB_00282e2d;
          pUVar2 = (this->fLocalDigitStrings).super_LocalPointerBase<const_icu_63::UnicodeString>.
                   ptr;
          if (0x1f < *(ushort *)((long)&pUVar2->fUnion + lVar13)) {
            iVar7 = StringSegment::getCommonPrefixLength
                              (segment,(UnicodeString *)
                                       ((long)&(pUVar2->super_Replaceable).super_UObject.
                                               _vptr_UObject + lVar13));
            sVar1 = *(short *)((long)&pUVar2->fUnion + lVar13);
            if (sVar1 < 0) {
              iVar10 = *(int *)((long)&pUVar2->fUnion + lVar13 + 4);
            }
            else {
              iVar10 = (int)sVar1 >> 5;
            }
            if (iVar7 == iVar10) goto LAB_00282dc3;
            bVar15 = !bVar3;
            bVar3 = true;
            if (bVar15) {
              iVar9 = StringSegment::length(segment);
              bVar3 = iVar7 == iVar9;
            }
          }
          uVar14 = uVar14 + 1;
          lVar13 = lVar13 + 0x40;
        } while( true );
      }
      bVar3 = false;
    }
    else {
      StringSegment::adjustOffset(segment,2 - (uint)(c < 0x10000));
      uVar8 = u_digit_63(c,'\n');
      uVar14 = (ulong)uVar8;
      if ((char)uVar8 == -1) goto LAB_00282d45;
      bVar3 = false;
      if (-1 < (char)uVar8) goto LAB_00282dd8;
    }
LAB_00282e2d:
    bVar15 = false;
    if (((actualDecimalString.fUnion._0_4_ & 1) != 0) &&
       (0x1f < (ushort)(this->decimalSeparator).fUnion.fStackFields.fLengthAndFlags)) {
      iVar7 = StringSegment::getCommonPrefixLength(segment,&this->decimalSeparator);
      bVar15 = bVar3 == false;
      bVar3 = true;
      if (bVar15) {
        iVar9 = StringSegment::length(segment);
        bVar3 = iVar7 == iVar9;
      }
      sVar1 = (this->decimalSeparator).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar10 = (this->decimalSeparator).fUnion.fFields.fLength;
      }
      else {
        iVar10 = (int)sVar1 >> 5;
      }
      if (iVar7 == iVar10) {
        bVar15 = true;
        UnicodeString::operator=(&actualDecimalString,&this->decimalSeparator);
      }
      else {
        bVar15 = false;
      }
    }
    uVar8 = (uint)(ushort)actualGroupingString.fUnion.fStackFields.fLengthAndFlags;
    if ((actualGroupingString.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
      iVar7 = StringSegment::getCommonPrefixLength(segment,&actualGroupingString);
      bVar16 = bVar3 == false;
      bVar3 = true;
      if (bVar16) {
        iVar9 = StringSegment::length(segment);
        bVar3 = iVar7 == iVar9;
      }
      uVar8 = (uint)actualGroupingString.fUnion.fStackFields.fLengthAndFlags;
      uVar12 = actualGroupingString.fUnion.fFields.fLength;
      if (-1 < actualGroupingString.fUnion.fStackFields.fLengthAndFlags) {
        uVar12 = (int)uVar8 >> 5;
      }
      bVar16 = iVar7 == uVar12;
    }
    else {
      bVar16 = false;
    }
    if ((((this->groupingDisabled == false) && ((uVar8 & 1) != 0)) &&
        ((actualDecimalString.fUnion._0_4_ & 1) != 0)) &&
       (0x1f < (ushort)(this->groupingSeparator).fUnion.fStackFields.fLengthAndFlags)) {
      iVar7 = StringSegment::getCommonPrefixLength(segment,&this->groupingSeparator);
      bVar17 = bVar3 == false;
      bVar3 = true;
      if (bVar17) {
        iVar9 = StringSegment::length(segment);
        bVar3 = iVar7 == iVar9;
      }
      sVar1 = (this->groupingSeparator).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar10 = (this->groupingSeparator).fUnion.fFields.fLength;
      }
      else {
        iVar10 = (int)sVar1 >> 5;
      }
      if (iVar7 != iVar10) goto LAB_00282f73;
      bVar16 = true;
      UnicodeString::operator=(&actualGroupingString,&this->groupingSeparator);
    }
    else {
LAB_00282f73:
      if (((!bVar16) && ((actualDecimalString.fUnion._0_4_ & 1) != 0)) &&
         (UVar4 = UnicodeSet::contains(this->decimalUniSet,c), UVar4 != '\0')) {
        UnicodeString::UnicodeString(&local_70,c);
        UnicodeString::moveFrom(&actualDecimalString,&local_70);
        UnicodeString::~UnicodeString(&local_70);
        bVar15 = true;
      }
    }
    if (((this->groupingDisabled == false) &&
        ((actualGroupingString.fUnion.fStackFields.fLengthAndFlags & 1U) != 0)) &&
       (((actualDecimalString.fUnion._0_4_ & 1) != 0 &&
        (UVar4 = UnicodeSet::contains(this->groupingUniSet,c), UVar4 != '\0')))) {
      UnicodeString::UnicodeString(&local_70,c);
      UnicodeString::moveFrom(&actualGroupingString,&local_70);
      UnicodeString::~UnicodeString(&local_70);
      bVar16 = true;
    }
    if (bVar15) {
      if (this->integerOnly != false) goto LAB_002831b1;
    }
    else if (!bVar16) goto LAB_002831b1;
    if ((local_184 == 2) && (bVar16)) {
      local_184 = 2;
      goto LAB_00283208;
    }
    bVar17 = validateGroup(this,sepType,local_178,false);
    bVar5 = validateGroup(this,local_184,local_18c,true);
    if ((!bVar17) || (!bVar5 && bVar15)) {
      if ((bool)(bVar16 & local_18c == 0)) {
        local_18c = 0;
      }
      else if (this->requireGroupingMatch == true) {
        icu_63::number::impl::DecimalQuantity::clear(&digitsConsumed);
        digitsConsumed.bogus = true;
      }
      goto LAB_002831b1;
    }
    if ((local_18c == 0 & this->requireGroupingMatch & local_184 == 1) != 0) goto LAB_0028316b;
    sepType = local_184;
    if (bVar15) {
      sepType = -1;
    }
    iVar7 = local_180;
    if (local_18c != 0) {
      iVar7 = StringSegment::getOffset(segment);
    }
    if (bVar16) {
      uVar12 = actualGroupingString.fUnion.fFields.fLength;
      if (-1 < actualGroupingString.fUnion.fStackFields.fLengthAndFlags) {
        uVar12 = (int)actualGroupingString.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      StringSegment::adjustOffset(segment,uVar12);
      local_178 = local_18c;
      local_17c = local_180;
      local_184 = 1;
      local_180 = iVar7;
    }
    else {
      uVar12 = actualDecimalString.fUnion.fFields.fLength;
      if (-1 < actualDecimalString.fUnion.fStackFields.fLengthAndFlags) {
        uVar12 = (int)actualDecimalString.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      StringSegment::adjustOffset(segment,uVar12);
      local_178 = local_18c;
      local_17c = local_180;
      local_184 = 2;
      local_180 = iVar7;
    }
  } while( true );
LAB_00282dc3:
  StringSegment::adjustOffset(segment,iVar7);
LAB_00282dd8:
  if (digitsConsumed.bogus == true) {
    digitsConsumed.bogus = false;
    icu_63::number::impl::DecimalQuantity::clear(&digitsConsumed);
  }
  icu_63::number::impl::DecimalQuantity::appendDigit(&digitsConsumed,(int8_t)uVar14,0,true);
  local_18c = local_18c + 1;
  local_154 = local_154 + (~actualDecimalString.fUnion._0_4_ & 1);
  goto LAB_00282ce5;
LAB_0028316b:
  local_18c = 0;
  local_184 = 1;
LAB_002831b1:
  if (local_18c == 0 && local_184 != 2) {
    StringSegment::setOffset(segment,local_180);
    bVar3 = true;
    local_188 = -1;
    local_18c = local_178;
    iVar7 = 0;
    local_178 = 1;
    local_184 = sepType;
  }
  else {
LAB_00283208:
    local_188 = local_17c;
    local_17c = local_180;
    iVar7 = sepType;
  }
  bVar15 = validateGroup(this,iVar7,local_178,false);
  bVar16 = validateGroup(this,local_184,local_18c,true);
  if (this->requireGroupingMatch == false) {
    if (bVar15) {
      bVar17 = iVar7 == 0 && local_178 == 0 || bVar16;
      bVar15 = true;
      bVar16 = true;
      if (bVar17) goto LAB_002832c1;
      bVar3 = true;
      StringSegment::setOffset(segment,local_17c);
    }
    else {
      StringSegment::setOffset(segment,local_188);
      local_18c = local_18c + local_178;
    }
    bVar15 = true;
    if (local_18c == 0) {
      bVar16 = true;
    }
    else {
      __file = (char *)(ulong)(uint)-local_18c;
      icu_63::number::impl::DecimalQuantity::adjustMagnitude(&digitsConsumed,-local_18c);
      icu_63::number::impl::DecimalQuantity::truncate(&digitsConsumed,__file,__length);
      bVar16 = true;
    }
  }
LAB_002832c1:
  if ((local_184 == 2) || ((bVar15 & bVar16) != 0)) {
    if ((digitsConsumed.bogus & 1U) == 0) {
      icu_63::number::impl::DecimalQuantity::adjustMagnitude(&digitsConsumed,-local_154);
      if ((exponentSign == '\0') || (iVar7 = StringSegment::getOffset(segment), iVar7 == iVar6)) {
        icu_63::number::impl::DecimalQuantity::operator=(&result->quantity,&digitsConsumed);
      }
      else {
        bVar15 = icu_63::number::impl::DecimalQuantity::fitsInLong(&digitsConsumed,false);
        if (((!bVar15) ||
            (iVar11 = icu_63::number::impl::DecimalQuantity::toLong(&digitsConsumed,false),
            0x7fffffff < iVar11)) ||
           (bVar15 = icu_63::number::impl::DecimalQuantity::adjustMagnitude
                               (&result->quantity,
                                (int)iVar11 * (int)CONCAT71(in_register_00000009,exponentSign)),
           bVar15)) {
          if (exponentSign == -1) {
            icu_63::number::impl::DecimalQuantity::clear(&result->quantity);
          }
          else {
            (result->quantity).bogus = true;
            *(byte *)&result->flags = (byte)result->flags | 0x80;
          }
        }
      }
      if ((actualDecimalString.fUnion._0_4_ & 1) == 0) {
        *(byte *)&result->flags = (byte)result->flags | 0x20;
      }
      ParsedNumber::setCharsConsumed(result,segment);
      iVar6 = StringSegment::length(segment);
      bVar15 = (bool)(iVar6 == 0 | bVar3);
      goto LAB_0028336d;
    }
  }
  else {
    digitsConsumed.bogus = true;
  }
  bVar15 = true;
  if (bVar3 == false) {
    iVar7 = StringSegment::length(segment);
    bVar15 = iVar7 == 0;
  }
  StringSegment::setOffset(segment,iVar6);
LAB_0028336d:
  UnicodeString::~UnicodeString(&actualDecimalString);
  UnicodeString::~UnicodeString(&actualGroupingString);
  icu_63::number::impl::DecimalQuantity::~DecimalQuantity(&digitsConsumed);
  return bVar15;
}

Assistant:

bool DecimalMatcher::match(StringSegment& segment, ParsedNumber& result, int8_t exponentSign,
                           UErrorCode&) const {
    if (result.seenNumber() && exponentSign == 0) {
        // A number has already been consumed.
        return false;
    } else if (exponentSign != 0) {
        // scientific notation always comes after the number
        U_ASSERT(!result.quantity.bogus);
    }

    // Initial offset before any character consumption.
    int32_t initialOffset = segment.getOffset();

    // Return value: whether to ask for more characters.
    bool maybeMore = false;

    // All digits consumed so far.
    number::impl::DecimalQuantity digitsConsumed;
    digitsConsumed.bogus = true;

    // The total number of digits after the decimal place, used for scaling the result.
    int32_t digitsAfterDecimalPlace = 0;

    // The actual grouping and decimal separators used in the string.
    // If non-null, we have seen that token.
    UnicodeString actualGroupingString;
    UnicodeString actualDecimalString;
    actualGroupingString.setToBogus();
    actualDecimalString.setToBogus();

    // Information for two groups: the previous group and the current group.
    //
    // Each group has three pieces of information:
    //
    // Offset: the string position of the beginning of the group, including a leading separator
    // if there was a leading separator. This is needed in case we need to rewind the parse to
    // that position.
    //
    // Separator type:
    // 0 => beginning of string
    // 1 => lead separator is a grouping separator
    // 2 => lead separator is a decimal separator
    //
    // Count: the number of digits in the group. If -1, the group has been validated.
    int32_t currGroupOffset = 0;
    int32_t currGroupSepType = 0;
    int32_t currGroupCount = 0;
    int32_t prevGroupOffset = -1;
    int32_t prevGroupSepType = -1;
    int32_t prevGroupCount = -1;

    while (segment.length() > 0) {
        maybeMore = false;

        // Attempt to match a digit.
        int8_t digit = -1;

        // Try by code point digit value.
        UChar32 cp = segment.getCodePoint();
        if (u_isdigit(cp)) {
            segment.adjustOffset(U16_LENGTH(cp));
            digit = static_cast<int8_t>(u_digit(cp, 10));
        }

        // Try by digit string.
        if (digit == -1 && !fLocalDigitStrings.isNull()) {
            for (int32_t i = 0; i < 10; i++) {
                const UnicodeString& str = fLocalDigitStrings[i];
                if (str.isEmpty()) {
                    continue;
                }
                int32_t overlap = segment.getCommonPrefixLength(str);
                if (overlap == str.length()) {
                    segment.adjustOffset(overlap);
                    digit = static_cast<int8_t>(i);
                    break;
                }
                maybeMore = maybeMore || (overlap == segment.length());
            }
        }

        if (digit >= 0) {
            // Digit was found.
            if (digitsConsumed.bogus) {
                digitsConsumed.bogus = false;
                digitsConsumed.clear();
            }
            digitsConsumed.appendDigit(digit, 0, true);
            currGroupCount++;
            if (!actualDecimalString.isBogus()) {
                digitsAfterDecimalPlace++;
            }
            continue;
        }

        // Attempt to match a literal grouping or decimal separator.
        bool isDecimal = false;
        bool isGrouping = false;

        // 1) Attempt the decimal separator string literal.
        // if (we have not seen a decimal separator yet) { ... }
        if (actualDecimalString.isBogus() && !decimalSeparator.isEmpty()) {
            int32_t overlap = segment.getCommonPrefixLength(decimalSeparator);
            maybeMore = maybeMore || (overlap == segment.length());
            if (overlap == decimalSeparator.length()) {
                isDecimal = true;
                actualDecimalString = decimalSeparator;
            }
        }

        // 2) Attempt to match the actual grouping string literal.
        if (!actualGroupingString.isBogus()) {
            int32_t overlap = segment.getCommonPrefixLength(actualGroupingString);
            maybeMore = maybeMore || (overlap == segment.length());
            if (overlap == actualGroupingString.length()) {
                isGrouping = true;
            }
        }

        // 2.5) Attempt to match a new the grouping separator string literal.
        // if (we have not seen a grouping or decimal separator yet) { ... }
        if (!groupingDisabled && actualGroupingString.isBogus() && actualDecimalString.isBogus() &&
            !groupingSeparator.isEmpty()) {
            int32_t overlap = segment.getCommonPrefixLength(groupingSeparator);
            maybeMore = maybeMore || (overlap == segment.length());
            if (overlap == groupingSeparator.length()) {
                isGrouping = true;
                actualGroupingString = groupingSeparator;
            }
        }

        // 3) Attempt to match a decimal separator from the equivalence set.
        // if (we have not seen a decimal separator yet) { ... }
        // The !isGrouping is to confirm that we haven't yet matched the current character.
        if (!isGrouping && actualDecimalString.isBogus()) {
            if (decimalUniSet->contains(cp)) {
                isDecimal = true;
                actualDecimalString = UnicodeString(cp);
            }
        }

        // 4) Attempt to match a grouping separator from the equivalence set.
        // if (we have not seen a grouping or decimal separator yet) { ... }
        if (!groupingDisabled && actualGroupingString.isBogus() && actualDecimalString.isBogus()) {
            if (groupingUniSet->contains(cp)) {
                isGrouping = true;
                actualGroupingString = UnicodeString(cp);
            }
        }

        // Leave if we failed to match this as a separator.
        if (!isDecimal && !isGrouping) {
            break;
        }

        // Check for conditions when we don't want to accept the separator.
        if (isDecimal && integerOnly) {
            break;
        } else if (currGroupSepType == 2 && isGrouping) {
            // Fraction grouping
            break;
        }

        // Validate intermediate grouping sizes.
        bool prevValidSecondary = validateGroup(prevGroupSepType, prevGroupCount, false);
        bool currValidPrimary = validateGroup(currGroupSepType, currGroupCount, true);
        if (!prevValidSecondary || (isDecimal && !currValidPrimary)) {
            // Invalid grouping sizes.
            if (isGrouping && currGroupCount == 0) {
                // Trailing grouping separators: these are taken care of below
                U_ASSERT(currGroupSepType == 1);
            } else if (requireGroupingMatch) {
                // Strict mode: reject the parse
                digitsConsumed.clear();
                digitsConsumed.bogus = true;
            }
            break;
        } else if (requireGroupingMatch && currGroupCount == 0 && currGroupSepType == 1) {
            break;
        } else {
            // Grouping sizes OK so far.
            prevGroupOffset = currGroupOffset;
            prevGroupCount = currGroupCount;
            if (isDecimal) {
                // Do not validate this group any more.
                prevGroupSepType = -1;
            } else {
                prevGroupSepType = currGroupSepType;
            }
        }

        // OK to accept the separator.
        // Special case: don't update currGroup if it is empty; this allows two grouping
        // separators in a row in lenient mode.
        if (currGroupCount != 0) {
            currGroupOffset = segment.getOffset();
        }
        currGroupSepType = isGrouping ? 1 : 2;
        currGroupCount = 0;
        if (isGrouping) {
            segment.adjustOffset(actualGroupingString.length());
        } else {
            segment.adjustOffset(actualDecimalString.length());
        }
    }

    // End of main loop.
    // Back up if there was a trailing grouping separator.
    // Shift prev -> curr so we can check it as a final group.
    if (currGroupSepType != 2 && currGroupCount == 0) {
        maybeMore = true;
        segment.setOffset(currGroupOffset);
        currGroupOffset = prevGroupOffset;
        currGroupSepType = prevGroupSepType;
        currGroupCount = prevGroupCount;
        prevGroupOffset = -1;
        prevGroupSepType = 0;
        prevGroupCount = 1;
    }

    // Validate final grouping sizes.
    bool prevValidSecondary = validateGroup(prevGroupSepType, prevGroupCount, false);
    bool currValidPrimary = validateGroup(currGroupSepType, currGroupCount, true);
    if (!requireGroupingMatch) {
        // The cases we need to handle here are lone digits.
        // Examples: "1,1"  "1,1,"  "1,1,1"  "1,1,1,"  ",1" (all parse as 1)
        // See more examples in numberformattestspecification.txt
        int32_t digitsToRemove = 0;
        if (!prevValidSecondary) {
            segment.setOffset(prevGroupOffset);
            digitsToRemove += prevGroupCount;
            digitsToRemove += currGroupCount;
        } else if (!currValidPrimary && (prevGroupSepType != 0 || prevGroupCount != 0)) {
            maybeMore = true;
            segment.setOffset(currGroupOffset);
            digitsToRemove += currGroupCount;
        }
        if (digitsToRemove != 0) {
            digitsConsumed.adjustMagnitude(-digitsToRemove);
            digitsConsumed.truncate();
        }
        prevValidSecondary = true;
        currValidPrimary = true;
    }
    if (currGroupSepType != 2 && (!prevValidSecondary || !currValidPrimary)) {
        // Grouping failure.
        digitsConsumed.bogus = true;
    }

    // Strings that start with a separator but have no digits,
    // or strings that failed a grouping size check.
    if (digitsConsumed.bogus) {
        maybeMore = maybeMore || (segment.length() == 0);
        segment.setOffset(initialOffset);
        return maybeMore;
    }

    // We passed all inspections. Start post-processing.

    // Adjust for fraction part.
    digitsConsumed.adjustMagnitude(-digitsAfterDecimalPlace);

    // Set the digits, either normal or exponent.
    if (exponentSign != 0 && segment.getOffset() != initialOffset) {
        bool overflow = false;
        if (digitsConsumed.fitsInLong()) {
            int64_t exponentLong = digitsConsumed.toLong(false);
            U_ASSERT(exponentLong >= 0);
            if (exponentLong <= INT32_MAX) {
                auto exponentInt = static_cast<int32_t>(exponentLong);
                if (result.quantity.adjustMagnitude(exponentSign * exponentInt)) {
                    overflow = true;
                }
            } else {
                overflow = true;
            }
        } else {
            overflow = true;
        }
        if (overflow) {
            if (exponentSign == -1) {
                // Set to zero
                result.quantity.clear();
            } else {
                // Set to infinity
                result.quantity.bogus = true;
                result.flags |= FLAG_INFINITY;
            }
        }
    } else {
        result.quantity = digitsConsumed;
    }

    // Set other information into the result and return.
    if (!actualDecimalString.isBogus()) {
        result.flags |= FLAG_HAS_DECIMAL_SEPARATOR;
    }
    result.setCharsConsumed(segment);
    return segment.length() == 0 || maybeMore;
}